

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

size_t kj::anon_unknown_0::getSmallStackSize(void)

{
  size_t sVar1;
  long local_28;
  int local_1c;
  WiderType<Decay<int>,_Decay<long>_> local_18;
  int local_c;
  
  local_c = 0x4000;
  local_1c = 0x40000;
  local_28 = __sysconf(0x4b);
  local_18 = min<int,long>(&local_1c,&local_28);
  sVar1 = max<int,long>(&local_c,&local_18);
  return sVar1;
}

Assistant:

inline size_t getSmallStackSize() {
#if !_WIN32
  // pthread_attr_setstacksize() requires a stack size of at least PTHREAD_STACK_MIN, which can
  // vary by platform.  We'll clamp that to a reasonable range for stack overflow tests, and skip
  // the pthread-based tests if we can't get it.
  return kj::max(16 * 1024, kj::min(256 * 1024, PTHREAD_STACK_MIN));
#else
  return 16 * 1024;
#endif
}